

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O0

void __thiscall cmCTestTestHandler::PopulateCustomVectors(cmCTestTestHandler *this,cmMakefile *mf)

{
  cmCTest *pcVar1;
  cmMakefile *pcVar2;
  allocator local_e9;
  string local_e8;
  allocator local_c1;
  string local_c0;
  allocator local_99;
  string local_98;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  cmMakefile *local_18;
  cmMakefile *mf_local;
  cmCTestTestHandler *this_local;
  
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  local_18 = mf;
  mf_local = (cmMakefile *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"CTEST_CUSTOM_PRE_TEST",&local_39);
  cmCTest::PopulateCustomVector(pcVar1,mf,&local_38,&this->CustomPreTest);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  pcVar2 = local_18;
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"CTEST_CUSTOM_POST_TEST",&local_71);
  cmCTest::PopulateCustomVector(pcVar1,pcVar2,&local_70,&this->CustomPostTest);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  pcVar2 = local_18;
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_98,"CTEST_CUSTOM_TESTS_IGNORE",&local_99);
  cmCTest::PopulateCustomVector(pcVar1,pcVar2,&local_98,&this->CustomTestsIgnore);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  pcVar2 = local_18;
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_c0,"CTEST_CUSTOM_MAXIMUM_PASSED_TEST_OUTPUT_SIZE",&local_c1);
  cmCTest::PopulateCustomInteger(pcVar1,pcVar2,&local_c0,&this->CustomMaximumPassedTestOutputSize);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  pcVar2 = local_18;
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_e8,"CTEST_CUSTOM_MAXIMUM_FAILED_TEST_OUTPUT_SIZE",&local_e9);
  cmCTest::PopulateCustomInteger(pcVar1,pcVar2,&local_e8,&this->CustomMaximumFailedTestOutputSize);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  return;
}

Assistant:

void cmCTestTestHandler::PopulateCustomVectors(cmMakefile* mf)
{
  this->CTest->PopulateCustomVector(mf, "CTEST_CUSTOM_PRE_TEST",
                                    this->CustomPreTest);
  this->CTest->PopulateCustomVector(mf, "CTEST_CUSTOM_POST_TEST",
                                    this->CustomPostTest);
  this->CTest->PopulateCustomVector(mf, "CTEST_CUSTOM_TESTS_IGNORE",
                                    this->CustomTestsIgnore);
  this->CTest->PopulateCustomInteger(
    mf, "CTEST_CUSTOM_MAXIMUM_PASSED_TEST_OUTPUT_SIZE",
    this->CustomMaximumPassedTestOutputSize);
  this->CTest->PopulateCustomInteger(
    mf, "CTEST_CUSTOM_MAXIMUM_FAILED_TEST_OUTPUT_SIZE",
    this->CustomMaximumFailedTestOutputSize);
}